

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine_unix.cpp
# Opt level: O0

bool __thiscall QFSFileEnginePrivate::doStat(QFSFileEnginePrivate *this,MetaDataFlags flags)

{
  bool bVar1;
  long in_RDI;
  long in_FS_OFFSET;
  int localFd;
  QFileSystemMetaData *in_stack_00000040;
  undefined4 in_stack_00000048;
  MetaDataFlags in_stack_0000012c;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  QFileSystemMetaData *in_stack_ffffffffffffffb0;
  QFileSystemMetaData *in_stack_ffffffffffffffb8;
  byte local_39;
  int local_2c;
  long lVar2;
  int fd;
  QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4> local_14;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = in_RDI;
  if (((*(byte *)(in_RDI + 0xc2) >> 2 & 1) == 0) ||
     (bVar1 = QFileSystemMetaData::hasFlags
                        ((QFileSystemMetaData *)
                         CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                         (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
                         SUB84((ulong)in_stack_ffffffffffffffb8 >> 0x20,0)), !bVar1)) {
    fd = (int)((ulong)lVar2 >> 0x20);
    *(byte *)(in_RDI + 0xc2) = *(byte *)(in_RDI + 0xc2) & 0xfb | 4;
    local_2c = *(int *)(in_RDI + 0xb8);
    if ((*(long *)(in_RDI + 0xa8) != 0) &&
       (bVar1 = QFileSystemEntry::isEmpty((QFileSystemEntry *)in_stack_ffffffffffffffb0), bVar1)) {
      local_2c = fileno(*(FILE **)(in_RDI + 0xa8));
    }
    if (local_2c != -1) {
      QFileSystemEngine::fillMetaData(fd,in_stack_ffffffffffffffb8);
    }
    local_14.super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i =
         (QFlagsStorage<QFileSystemMetaData::MetaDataFlag>)
         QFileSystemMetaData::missingFlags
                   (in_stack_ffffffffffffffb0,
                    (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
                    SUB84((ulong)in_stack_ffffffffffffffb8 >> 0x20,0));
    bVar1 = ::QFlags::operator_cast_to_bool((QFlags *)&local_14);
    local_39 = 0;
    if (bVar1) {
      bVar1 = QFileSystemEntry::isEmpty((QFileSystemEntry *)in_stack_ffffffffffffffb0);
      local_39 = bVar1 ^ 0xff;
    }
    if ((local_39 & 1) != 0) {
      QFileSystemMetaData::missingFlags
                ((QFileSystemMetaData *)(in_RDI + 0x30),
                 (QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>)
                 SUB84((ulong)(in_RDI + 0x70) >> 0x20,0));
      QFileSystemEngine::fillMetaData
                ((QFileSystemEntry *)
                 CONCAT44(flags.super_QFlagsStorageHelper<QFileSystemMetaData::MetaDataFlag,_4>.
                          super_QFlagsStorage<QFileSystemMetaData::MetaDataFlag>.i,in_stack_00000048
                         ),in_stack_00000040,in_stack_0000012c);
    }
  }
  bVar1 = QFileSystemMetaData::exists((QFileSystemMetaData *)0x6a7ae9);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool QFSFileEnginePrivate::doStat(QFileSystemMetaData::MetaDataFlags flags) const
{
    if (!tried_stat || !metaData.hasFlags(flags)) {
        tried_stat = 1;

        int localFd = fd;
        if (fh && fileEntry.isEmpty())
            localFd = QT_FILENO(fh);
        if (localFd != -1)
            QFileSystemEngine::fillMetaData(localFd, metaData);

        if (metaData.missingFlags(flags) && !fileEntry.isEmpty())
            QFileSystemEngine::fillMetaData(fileEntry, metaData, metaData.missingFlags(flags));
    }

    return metaData.exists();
}